

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  long lVar2;
  char *outFileName;
  bool verbose;
  int iVar3;
  int iVar4;
  Extrapolation extX;
  Extrapolation extY;
  int iVar5;
  long *plVar6;
  Header *pHVar7;
  undefined8 *puVar8;
  char *pcVar9;
  invalid_argument *piVar10;
  ostream *poVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  LevelMode mode;
  LevelRoundingMode local_284;
  allocator<char> local_279;
  Compression local_278;
  int local_274;
  long local_270;
  char *local_268;
  char *local_260;
  long local_258;
  Compression c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  long local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  MultiPartInputFile input;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  long local_200;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doNotFilter;
  stringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mode = ONE_LEVEL;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc < 2) {
    iVar5 = -1;
    anon_unknown.dwarf_104f1::usageMessage((ostream *)&std::cerr,*argv,false);
  }
  else {
    iVar5 = argc + -2;
    local_274 = argc + -3;
    local_278 = ZIP_COMPRESSION;
    local_258 = 0x40;
    extY = CLAMP;
    local_268 = (char *)0x0;
    local_260 = (char *)0x0;
    local_284 = ROUND_DOWN;
    verbose = false;
    extX = CLAMP;
    local_200 = 0x40;
    local_270 = 0;
    uVar14 = 1;
    do {
      pcVar9 = argv[uVar14];
      iVar3 = strcmp(pcVar9,"-o");
      if (iVar3 == 0) {
        mode = ONE_LEVEL;
        iVar3 = 1;
        pcVar9 = local_260;
      }
      else {
        iVar4 = strcmp(pcVar9,"-m");
        iVar3 = 1;
        if (iVar4 == 0) {
          mode = MIPMAP_LEVELS;
          pcVar9 = local_260;
        }
        else {
          iVar4 = strcmp(pcVar9,"-r");
          if (iVar4 == 0) {
            mode = RIPMAP_LEVELS;
            pcVar9 = local_260;
          }
          else {
            iVar4 = strcmp(pcVar9,"-f");
            if (iVar4 == 0) {
              if (iVar5 < (int)uVar14) {
                piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar10,"missing filter value with -f option");
                goto LAB_001060b3;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,argv[(ulong)uVar14 + 1],(allocator<char> *)&input);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&doNotFilter,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
              uVar12 = local_1a8[0]._M_allocated_capacity;
              _Var13._M_p = _e;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_e != local_1a8) {
LAB_0010592d:
                operator_delete(_Var13._M_p,uVar12 + 1);
              }
LAB_00105935:
              iVar3 = 2;
              pcVar9 = local_260;
            }
            else {
              iVar4 = strcmp(pcVar9,"-e");
              if (iVar4 == 0) {
                if (local_274 < (int)uVar14) {
                  piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar10,"missing extrapolation values with -e option");
                  goto LAB_001060b3;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,argv[(ulong)uVar14 + 1],(allocator<char> *)&input);
                extX = anon_unknown.dwarf_104f1::getExtrapolation((string *)&e);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_e != local_1a8) {
                  operator_delete(_e,local_1a8[0]._M_allocated_capacity + 1);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,argv[(ulong)uVar14 + 2],(allocator<char> *)&input);
                extY = anon_unknown.dwarf_104f1::getExtrapolation((string *)&e);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_e != local_1a8) {
                  operator_delete(_e,local_1a8[0]._M_allocated_capacity + 1);
                }
                iVar3 = 3;
                pcVar9 = local_260;
              }
              else {
                iVar4 = strcmp(pcVar9,"-t");
                if (iVar4 == 0) {
                  if (local_274 < (int)uVar14) {
                    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument
                              (piVar10,"missing tile size with -t option");
                  }
                  else {
                    local_200 = strtol(argv[(ulong)uVar14 + 1],(char **)0x0,0);
                    local_258 = strtol(argv[(ulong)uVar14 + 2],(char **)0x0,0);
                    if (0 < (int)local_200) {
                      iVar3 = 3;
                      pcVar9 = local_260;
                      if (0 < (int)local_258) goto LAB_00105b5b;
                    }
                    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument
                              (piVar10,"Tile size must be greater than zero");
                  }
                  goto LAB_001060b3;
                }
                iVar4 = strcmp(pcVar9,"-d");
                if (iVar4 == 0) {
                  local_284 = ROUND_DOWN;
                  pcVar9 = local_260;
                }
                else {
                  iVar4 = strcmp(pcVar9,"-u");
                  iVar3 = 1;
                  if (iVar4 == 0) {
                    local_284 = ROUND_UP;
                    pcVar9 = local_260;
                  }
                  else {
                    iVar4 = strcmp(pcVar9,"-z");
                    if (iVar4 == 0) {
                      if ((int)uVar14 <= iVar5) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_248,argv[(ulong)uVar14 + 1],&local_279);
                        Imf_3_4::getCompressionIdFromName((string *)&local_248,&c);
                        if (c == NUM_COMPRESSION_METHODS) {
                          std::__cxx11::stringstream::stringstream((stringstream *)&e);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8[0]._M_local_buf,
                                     "Unknown compression method \"",0x1c);
                          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1a8[0]._M_local_buf,
                                               local_248->_M_local_buf,local_240);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::invalid_argument::invalid_argument(piVar10,(string *)&input);
                          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        uVar12 = local_238._M_allocated_capacity;
                        _Var13._M_p = (pointer)local_248;
                        local_278 = c;
                        if (local_248 != &local_238) goto LAB_0010592d;
                        goto LAB_00105935;
                      }
                      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                      std::invalid_argument::invalid_argument
                                (piVar10,"Missing compression value with -z option");
                      goto LAB_001060b3;
                    }
                    iVar4 = strcmp(pcVar9,"-v");
                    if (iVar4 == 0) {
                      verbose = true;
                      pcVar9 = local_260;
                    }
                    else {
                      iVar4 = strcmp(pcVar9,"-p");
                      if (iVar4 == 0) {
                        if (iVar5 < (int)uVar14) {
                          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar10,"Missing part num with -p option");
                          goto LAB_001060b3;
                        }
                        local_270 = strtol(argv[(ulong)uVar14 + 1],(char **)0x0,0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"part number: ",0xd);
                        plVar6 = (long *)std::ostream::operator<<
                                                   ((ostream *)&std::cout,(int)local_270);
                        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                        std::ostream::put((char)plVar6);
                        iVar3 = 2;
                        std::ostream::flush();
                        pcVar9 = local_260;
                      }
                      else {
                        iVar4 = strcmp(pcVar9,"-h");
                        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--help"), iVar4 == 0)) {
                          anon_unknown.dwarf_104f1::usageMessage
                                    ((ostream *)&std::cout,"exrmaketiled",true);
                          goto LAB_00105cff;
                        }
                        iVar4 = strcmp(pcVar9,"--version");
                        if (iVar4 == 0) {
                          pcVar9 = (char *)Imf_3_4::getLibraryVersion();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"exrmaketiled (OpenEXR) ",0x17);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"3.4.0",5);
                          iVar5 = strcmp(pcVar9,"3.4.0");
                          if (iVar5 != 0) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"(OpenEXR version ",0x11);
                            poVar11 = std::operator<<((ostream *)&std::cout,pcVar9);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout," https://openexr.com",0x14);
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "Copyright (c) Contributors to the OpenEXR Project",0x31);
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          goto LAB_00105cff;
                        }
                        if (local_268 == (char *)0x0) {
                          local_268 = pcVar9;
                          pcVar9 = local_260;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00105b5b:
      local_260 = pcVar9;
      outFileName = local_260;
      pcVar9 = local_268;
      uVar14 = uVar14 + iVar3;
    } while ((int)uVar14 < argc);
    if (local_260 != (char *)0x0 && local_268 != (char *)0x0) {
      iVar5 = strcmp(local_268,local_260);
      if (iVar5 == 0) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar10,"Input and output cannot be the same file");
LAB_001060b3:
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar5 = Imf_3_4::globalThreadCount();
      lVar2 = local_270;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(&input,pcVar9,iVar5,true);
      iVar5 = Imf_3_4::MultiPartInputFile::parts();
      iVar3 = (int)lVar2;
      if ((iVar3 < 0) || (iVar5 <= iVar3)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,"You asked for part ",0x13);
        poVar11 = (ostream *)
                  std::ostream::operator<<((ostream *)local_1a8[0]._M_local_buf,(int)local_270);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," in ",4);
        poVar11 = std::operator<<(poVar11,local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", which only has ",0x11);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," parts",6);
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar10,(string *)&local_248);
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
      Imf_3_4::Header::Header((Header *)&e,pHVar7);
      puVar8 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      sVar1 = puVar8[1];
      if ((sVar1 != _DAT_0010f410) ||
         ((sVar1 != 0 &&
          (iVar5 = bcmp((void *)*puVar8,Imf_3_4::DEEPTILE_abi_cxx11_,sVar1), iVar5 != 0)))) {
        puVar8 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        sVar1 = puVar8[1];
        if ((sVar1 != _DAT_0010f3f0) ||
           ((sVar1 != 0 &&
            (iVar5 = bcmp((void *)*puVar8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1), iVar5 != 0)))) {
          Imf_3_4::Header::~Header((Header *)&e);
          if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
          }
          if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
          }
          makeTiled(pcVar9,outFileName,iVar3,mode,local_284,local_278,(int)local_200,(int)local_258,
                    &doNotFilter,extX,extY,verbose);
LAB_00105cff:
          iVar5 = 0;
          goto LAB_00105d01;
        }
      }
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar10,"Cannot make tile for deep data");
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar5 = -1;
    anon_unknown.dwarf_104f1::usageMessage((ostream *)&std::cerr,*argv,false);
  }
LAB_00105d01:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&doNotFilter._M_t);
  return iVar5;
}

Assistant:

int
main (int argc, char** argv)
{
    const char*       inFile       = 0;
    const char*       outFile      = 0;
    LevelMode         mode         = ONE_LEVEL;
    LevelRoundingMode roundingMode = ROUND_DOWN;
    Compression       compression  = ZIP_COMPRESSION;
    int               tileSizeX    = 64;
    int               tileSizeY    = 64;
    set<string>       doNotFilter;
    Extrapolation     extX    = CLAMP;
    Extrapolation     extY    = CLAMP;
    bool              verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i       = 1;
        int partnum = 0;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-o"))
            {
                //
                // generate a ONE_LEVEL image
                //

                mode = ONE_LEVEL;
                i += 1;
            }
            else if (!strcmp (argv[i], "-m"))
            {
                //
                // Generate a MIPMAP_LEVELS image
                //

                mode = MIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-r"))
            {
                //
                // Generate a RIPMAP_LEVELS image
                //

                mode = RIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-f"))
            {
                //
                // Don't low-pass filter the specified image channel
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "missing filter value with -f option");

                doNotFilter.insert (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set x and y extrapolation method
                //

                if (i > argc - 3)
                    throw invalid_argument (
                        "missing extrapolation values with -e option");

                extX = getExtrapolation (argv[i + 1]);
                extY = getExtrapolation (argv[i + 2]);
                i += 3;
            }
            else if (!strcmp (argv[i], "-t"))
            {
                //
                // Set tile size
                //

                if (i > argc - 3)
                    throw invalid_argument ("missing tile size with -t option");

                tileSizeX = strtol (argv[i + 1], 0, 0);
                tileSizeY = strtol (argv[i + 2], 0, 0);

                if (tileSizeX <= 0 || tileSizeY <= 0)
                    throw invalid_argument (
                        "Tile size must be greater than zero");

                i += 3;
            }
            else if (!strcmp (argv[i], "-d"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_DOWN;
                i += 1;
            }
            else if (!strcmp (argv[i], "-u"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_UP;
                i += 1;
            }
            else if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-p"))
            {
                getPartNum (argc, argv, i, &partnum);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmaketiled", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmaketiled (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        //
        // Load inFile, and save a tiled version in outFile.
        //

        //
        // check input
        //
        {
            MultiPartInputFile input (inFile);
            int                parts = input.parts ();

            if (partnum < 0 || partnum >= parts)
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << inFile
                  << ", which only has " << parts << " parts";
                throw invalid_argument (e.str ());
            }

            Header h = input.header (partnum);
            if (h.type () == DEEPTILE || h.type () == DEEPSCANLINE)
                throw invalid_argument ("Cannot make tile for deep data");
        }

        makeTiled (
            inFile,
            outFile,
            partnum,
            mode,
            roundingMode,
            compression,
            tileSizeX,
            tileSizeY,
            doNotFilter,
            extX,
            extY,
            verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}